

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

void fill_topten_entry(toptenentry *newtt,int how)

{
  char *__dest;
  boolean bVar1;
  schar sVar2;
  xchar xVar3;
  __uid_t _Var4;
  char *__src;
  long lVar5;
  int iVar6;
  size_t sVar7;
  
  _Var4 = getuid();
  memset(newtt,0,0xc0);
  newtt->patchlevel = 1;
  newtt->points = u.urscore;
  xVar3 = u.uz.dnum;
  newtt->deathdnum = (int)u.uz.dnum;
  if (xVar3 == dungeon_topology.d_astral_level.dnum) {
    bVar1 = on_level(&u.uz,&dungeon_topology.d_astral_level);
    iVar6 = -5;
    if (bVar1 == '\0') {
      bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
      iVar6 = -4;
      if (bVar1 == '\0') {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_fire_level);
        iVar6 = -3;
        if (bVar1 == '\0') {
          bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
          iVar6 = -2;
          if (bVar1 == '\0') {
            bVar1 = on_level(&u.uz,&dungeon_topology.d_earth_level);
            iVar6 = -(uint)(bVar1 != '\0');
          }
        }
      }
    }
  }
  else {
    sVar2 = depth(&u.uz);
    iVar6 = (int)sVar2;
  }
  newtt->deathlev = iVar6;
  xVar3 = deepest_lev_reached('\x01');
  newtt->maxlvl = (int)xVar3;
  newtt->hp = u.uhp;
  newtt->maxhp = u.uhpmax;
  newtt->deaths = u.umortality;
  newtt->uid = _Var4;
  newtt->moves = moves;
  newtt->how = how;
  strncpy(newtt->plrole,urole.filecode,3);
  newtt->plrole[3] = '\0';
  strncpy(newtt->plrace,urace.filecode,3);
  newtt->plrace[3] = '\0';
  strncpy(newtt->plgend,genders[flags.female].filecode,3);
  newtt->plgend[3] = '\0';
  strncpy(newtt->plalign,aligns[1 - (long)u.ualign.type].filecode,3);
  newtt->plalign[3] = '\0';
  strncpy(newtt->name,plname,0xf);
  *(undefined2 *)(newtt->name + 0xf) = 0;
  __dest = newtt->death;
  if (killer_format == 0) {
LAB_0025f5b9:
    strcat(__dest,killed_by_prefix[how]);
    __src = an(killer);
  }
  else {
    if (killer_format != 1) {
      if (killer_format == 2) {
        sVar7 = 99;
        __src = killer;
        goto LAB_0025f5f7;
      }
      warning("bad killer format?");
      goto LAB_0025f5b9;
    }
    strcat(__dest,killed_by_prefix[how]);
    __src = killer;
  }
  sVar7 = strlen(__dest);
  sVar7 = 99 - sVar7;
LAB_0025f5f7:
  strncat(__dest,__src,sVar7);
  lVar5 = yyyymmdd(0x25f608);
  newtt->birthdate = (int)lVar5;
  lVar5 = yyyymmdd(0x25f612);
  newtt->deathdate = (int)lVar5;
  time(&deathtime_internal);
  return;
}

Assistant:

static void fill_topten_entry(struct toptenentry *newtt, int how)
{
    int uid = getuid();
    memset(newtt, 0, sizeof(struct toptenentry));
    
    /* deepest_lev_reached() is in terms of depth(), and reporting the
     * deepest level reached in the dungeon death occurred in doesn't
     * seem right, so we have to report the death level in depth() terms
     * as well (which also seems reasonable since that's all the player
     * sees on the screen anyway)
     */
    newtt->ver_major = VERSION_MAJOR;
    newtt->ver_minor = VERSION_MINOR;
    newtt->patchlevel = PATCHLEVEL;
    newtt->points = u.urscore;
    newtt->deathdnum = u.uz.dnum;
    newtt->deathlev = observable_depth(&u.uz);
    newtt->maxlvl = deepest_lev_reached(TRUE);
    newtt->hp = u.uhp;
    newtt->maxhp = u.uhpmax;
    newtt->deaths = u.umortality;
    newtt->uid = uid;
    newtt->moves = moves;
    newtt->how = how;
    strncpy(newtt->plrole, urole.filecode, ROLESZ);
    newtt->plrole[ROLESZ] = '\0';
    strncpy(newtt->plrace, urace.filecode, ROLESZ);
    newtt->plrace[ROLESZ] = '\0';
    strncpy(newtt->plgend, genders[flags.female].filecode, ROLESZ);
    newtt->plgend[ROLESZ] = '\0';
    strncpy(newtt->plalign, aligns[1-u.ualign.type].filecode, ROLESZ);
    newtt->plalign[ROLESZ] = '\0';
    strncpy(newtt->name, plname, NAMSZ);
    newtt->name[NAMSZ] = '\0';
    newtt->death[0] = '\0';
    switch (killer_format) {
	default: warning("bad killer format?");
	case KILLED_BY_AN:
	    strcat(newtt->death, killed_by_prefix[how]);
	    strncat(newtt->death, an(killer),
				    DTHSZ-strlen(newtt->death));
	    break;
	case KILLED_BY:
	    strcat(newtt->death, killed_by_prefix[how]);
	    strncat(newtt->death, killer, DTHSZ-strlen(newtt->death));
	    break;
	case NO_KILLER_PREFIX:
	    strncat(newtt->death, killer, DTHSZ);
	    break;
    }
    newtt->birthdate = yyyymmdd(u.ubirthday);
    newtt->deathdate = yyyymmdd((time_t)0L);
    time(&deathtime_internal);
}